

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_talk_to_dead(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  OBJ_DATA *pOVar1;
  __type_conflict2 _Var2;
  char buf [4608];
  char *obj_name;
  OBJ_DATA *corpse;
  void *in_stack_ffffffffffffedb8;
  char *in_stack_ffffffffffffedc0;
  void *arg1;
  CHAR_DATA *in_stack_ffffffffffffedc8;
  char *in_stack_ffffffffffffedd0;
  char *in_stack_ffffffffffffede8;
  
  if (*target_name == '\0') {
    send_to_char(in_stack_ffffffffffffedd0,in_stack_ffffffffffffedc8);
  }
  else {
    palloc_string(in_stack_ffffffffffffede8);
    pOVar1 = get_obj_here(in_stack_ffffffffffffedc8,in_stack_ffffffffffffedc0);
    if (pOVar1 == (OBJ_DATA *)0x0) {
      send_to_char(in_stack_ffffffffffffedd0,in_stack_ffffffffffffedc8);
    }
    else if ((pOVar1->item_type == 0x18) || (pOVar1->item_type == 0x17)) {
      arg1 = (void *)pOVar1->extra_flags[0];
      _Var2 = std::pow<int,int>(0,0x61f304);
      if (((ulong)arg1 & (long)_Var2) == 0) {
        act(in_stack_ffffffffffffedd0,in_stack_ffffffffffffedc8,arg1,in_stack_ffffffffffffedb8,0);
        sprintf(&stack0xffffffffffffedc8,
                "The spirit tells you \'I was slain by %s, now allow me my peace.\'\n\r",
                pOVar1->talked);
        send_to_char(in_stack_ffffffffffffedd0,in_stack_ffffffffffffedc8);
        act(in_stack_ffffffffffffedd0,in_stack_ffffffffffffedc8,arg1,in_stack_ffffffffffffedb8,0);
      }
      else {
        act(in_stack_ffffffffffffedd0,in_stack_ffffffffffffedc8,arg1,in_stack_ffffffffffffedb8,0);
      }
    }
    else {
      send_to_char(in_stack_ffffffffffffedd0,in_stack_ffffffffffffedc8);
    }
  }
  return;
}

Assistant:

void spell_talk_to_dead(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	OBJ_DATA *corpse;
	char *obj_name;
	char buf[MAX_STRING_LENGTH];

	if (target_name[0] == '\0')
	{
		send_to_char("Attempt to commune with which corpse?\n\r", ch);
		return;
	}

	obj_name = palloc_string(target_name);
	corpse = get_obj_here(ch, obj_name);

	if (corpse == nullptr)
	{
		send_to_char("You can't find that here.\n\r", ch);
		return;
	}

	if ((corpse->item_type != ITEM_CORPSE_PC) && (corpse->item_type != ITEM_CORPSE_NPC))
	{
		send_to_char("That object is not a corpse you can commune with.\n\r", ch);
		return;
	}

	if (IS_SET(corpse->extra_flags, CORPSE_NO_ANIMATE))
	{
		act("$p shudders slightly and a soft moan reaches your ears before it goes silent.", ch, corpse, 0, TO_CHAR);
		return;
	}

	act("You draw back the spirit of the fallen and $p speaks briefly to you.", ch, corpse, 0, TO_CHAR);

	sprintf(buf, "The spirit tells you 'I was slain by %s, now allow me my peace.'\n\r", corpse->talked);
	send_to_char(buf, ch);

	act("A faint glow surrounds $p and then fades away.", ch, corpse, 0, TO_ROOM);
}